

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferCopyTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::BufferCopyTests::init(BufferCopyTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  TestNode *pTVar7;
  char *pcVar8;
  long *plVar9;
  BufferCase *pBVar10;
  TestNode *pTVar11;
  long *extraout_RAX;
  long *extraout_RAX_00;
  long *plVar12;
  long lVar13;
  long lVar14;
  string name;
  allocator<char> local_a9;
  long local_a8;
  TestNode *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  TestNode *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic buffer copy cases");
  local_a0 = pTVar7;
  local_58 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  lVar13 = 0;
  local_a8 = 0;
  do {
    lVar14 = 0;
    do {
      if (lVar13 != lVar14) {
        dVar1 = init::bufferTargets[local_a8];
        dVar2 = *(deUint32 *)((long)init::bufferTargets + lVar14);
        pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar8,&local_a9);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_50);
        local_98 = &local_88;
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          local_88 = *plVar12;
          lStack_80 = plVar9[3];
        }
        else {
          local_88 = *plVar12;
          local_98 = (long *)*plVar9;
        }
        local_90 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        deqp::gls::BufferTestUtil::getBufferTargetName(dVar2);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_78 = &local_68;
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          local_68 = *plVar12;
          lStack_60 = plVar9[3];
        }
        else {
          local_68 = *plVar12;
          local_78 = (long *)*plVar9;
        }
        local_70 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pBVar10 = (BufferCase *)operator_new(0xe8);
        deqp::gls::BufferTestUtil::BufferCase::BufferCase
                  (pBVar10,((Context *)local_58[1]._vptr_TestNode)->m_testCtx,
                   ((Context *)local_58[1]._vptr_TestNode)->m_renderCtx,(char *)local_78,
                   glcts::fixed_sample_locations_values + 1);
        (pBVar10->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BufferCase_02199268;
        *(deUint32 *)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
        *(undefined8 *)((long)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
             0x88e4000003f9;
        *(deUint32 *)((long)&pBVar10[1].super_TestCase.super_TestNode.m_testCtx + 4) = dVar2;
        pBVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x88e4000003f9;
        pBVar10[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
        pBVar10[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0x3f9;
        tcu::TestNode::addChild(local_a0,(TestNode *)pBVar10);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
      }
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x20);
    local_a8 = local_a8 + 1;
    lVar13 = lVar13 + 4;
  } while (local_a8 != 8);
  pTVar11 = (TestNode *)operator_new(0x70);
  pTVar7 = local_58;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,local_58->m_testCtx,"subrange","Buffer subrange copy tests");
  tcu::TestNode::addChild(pTVar7,pTVar11);
  lVar13 = 0x18;
  local_a0 = pTVar11;
  do {
    pBVar10 = (BufferCase *)operator_new(0xe8);
    uVar3 = *(undefined4 *)((long)&PTR_iterate_02199150 + lVar13);
    uVar4 = *(undefined4 *)((long)&PTR_iterate_02199150 + lVar13 + 4);
    uVar5 = *(undefined4 *)(&UNK_02199158 + lVar13);
    local_a8 = CONCAT44(local_a8._4_4_,*(undefined4 *)(&UNK_0219915c + lVar13));
    uVar6 = *(undefined4 *)((long)&init::cases[0].name + lVar13);
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar10,(TestContext *)*pTVar7[1]._vptr_TestNode,
               (RenderContext *)pTVar7[1]._vptr_TestNode[1],
               *(char **)((long)&PTR_deinit_02199148 + lVar13),
               glcts::fixed_sample_locations_values + 1);
    (pBVar10->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__BufferCase_02199268;
    *(undefined4 *)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode = 0x8f36;
    *(undefined4 *)((long)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar3;
    pBVar10[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x8f37000088e4;
    *(undefined4 *)&pBVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = uVar4;
    *(undefined4 *)((long)&pBVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
         0x88e4;
    *(undefined4 *)&pBVar10[1].super_TestCase.super_TestNode.m_name._M_string_length = uVar5;
    *(undefined4 *)((long)&pBVar10[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
         (undefined4)local_a8;
    *(undefined4 *)&pBVar10[1].super_TestCase.super_TestNode.m_name.field_2 = uVar6;
    *(undefined4 *)((long)&pBVar10[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
    tcu::TestNode::addChild(local_a0,(TestNode *)pBVar10);
    pTVar7 = local_58;
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0xf8);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar7->m_testCtx,"single_buffer",
             "Copies within single buffer");
  local_a0 = pTVar11;
  tcu::TestNode::addChild(pTVar7,pTVar11);
  lVar13 = 0;
  local_a8 = 0;
  plVar9 = extraout_RAX;
  do {
    lVar14 = 0;
    do {
      if (lVar13 != lVar14) {
        dVar1 = init::bufferTargets[local_a8];
        dVar2 = *(deUint32 *)((long)init::bufferTargets + lVar14);
        pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar8,&local_a9);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_50);
        local_98 = &local_88;
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          local_88 = *plVar12;
          lStack_80 = plVar9[3];
        }
        else {
          local_88 = *plVar12;
          local_98 = (long *)*plVar9;
        }
        local_90 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        deqp::gls::BufferTestUtil::getBufferTargetName(dVar2);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_78 = &local_68;
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          local_68 = *plVar12;
          lStack_60 = plVar9[3];
        }
        else {
          local_68 = *plVar12;
          local_78 = (long *)*plVar9;
        }
        local_70 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pBVar10 = (BufferCase *)operator_new(0xd0);
        deqp::gls::BufferTestUtil::BufferCase::BufferCase
                  (pBVar10,(TestContext *)*local_58[1]._vptr_TestNode,
                   (RenderContext *)local_58[1]._vptr_TestNode[1],(char *)local_78,
                   glcts::fixed_sample_locations_values + 1);
        (pBVar10->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BufferCase_021992b8;
        *(deUint32 *)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
        *(deUint32 *)((long)&pBVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
        pBVar10[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x88e4;
        tcu::TestNode::addChild(local_a0,(TestNode *)pBVar10);
        plVar9 = &local_68;
        if (local_78 != plVar9) {
          operator_delete(local_78,local_68 + 1);
          plVar9 = extraout_RAX_00;
        }
      }
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x20);
    local_a8 = local_a8 + 1;
    lVar13 = lVar13 + 4;
  } while (local_a8 != 8);
  return (int)plVar9;
}

Assistant:

void BufferCopyTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic buffer copy cases");
		addChild(basicGroup);

		for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); srcTargetNdx++)
		{
			for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); dstTargetNdx++)
			{
				if (srcTargetNdx == dstTargetNdx)
					continue;

				deUint32		srcTarget		= bufferTargets[srcTargetNdx];
				deUint32		dstTarget		= bufferTargets[dstTargetNdx];
				const int		size			= 1017;
				const deUint32	hint			= GL_STATIC_DRAW;
				VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;
				string			name			= string(getBufferTargetName(srcTarget)) + "_" + getBufferTargetName(dstTarget);

				basicGroup->addChild(new BasicBufferCopyCase(m_context, name.c_str(), "", srcTarget, size, hint, dstTarget, size, hint, 0, 0, size, verify));
			}
		}
	}

	// .subrange
	{
		tcu::TestCaseGroup* subrangeGroup = new tcu::TestCaseGroup(m_testCtx, "subrange", "Buffer subrange copy tests");
		addChild(subrangeGroup);

		static const struct
		{
			const char*		name;
			int				srcSize;
			int				dstSize;
			int				srcOffset;
			int				dstOffset;
			int				copySize;
		} cases[] =
		{
			//						srcSize		dstSize		srcOffs		dstOffs		copySize
			{ "middle",				1000,		1000,		250,		250,		500 },
			{ "small_to_large",		100,		1000,		0,			409,		100 },
			{ "large_to_small",		1000,		100,		409,		0,			100 },
			{ "low_to_high_1",		1000,		1000,		0,			500,		500 },
			{ "low_to_high_2",		997,		1027,		0,			701,		111 },
			{ "high_to_low_1",		1000,		1000,		500,		0,			500 },
			{ "high_to_low_2",		1027,		997,		701,		17,			111 }
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		{
			deUint32		srcTarget		= GL_COPY_READ_BUFFER;
			deUint32		dstTarget		= GL_COPY_WRITE_BUFFER;
			deUint32		hint			= GL_STATIC_DRAW;
			VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;

			subrangeGroup->addChild(new BasicBufferCopyCase(m_context, cases[ndx].name, "",
															srcTarget, cases[ndx].srcSize, hint,
															dstTarget, cases[ndx].dstSize, hint,
															cases[ndx].srcOffset, cases[ndx].dstOffset, cases[ndx].copySize,
															verify));
		}
	}

	// .single_buffer
	{
		tcu::TestCaseGroup* singleBufGroup = new tcu::TestCaseGroup(m_testCtx, "single_buffer", "Copies within single buffer");
		addChild(singleBufGroup);

		for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); srcTargetNdx++)
		{
			for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); dstTargetNdx++)
			{
				if (srcTargetNdx == dstTargetNdx)
					continue;

				deUint32		srcTarget		= bufferTargets[srcTargetNdx];
				deUint32		dstTarget		= bufferTargets[dstTargetNdx];
				const deUint32	hint			= GL_STATIC_DRAW;
				VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;
				string			name			= string(getBufferTargetName(srcTarget)) + "_" + getBufferTargetName(dstTarget);

				singleBufGroup->addChild(new SingleBufferCopyCase(m_context, name.c_str(), "", srcTarget, dstTarget, hint, verify));
			}
		}
	}
}